

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

int kvtree_print_mode(kvtree *hash,int indent,int mode)

{
  kvtree_elem *local_428;
  kvtree_elem *elem;
  undefined1 local_418 [4];
  int i;
  char tmp [1024];
  int mode_local;
  int indent_local;
  kvtree *hash_local;
  
  tmp._1016_4_ = mode;
  tmp._1020_4_ = indent;
  for (elem._4_4_ = 0; elem._4_4_ < (int)tmp._1020_4_; elem._4_4_ = elem._4_4_ + 1) {
    local_418[elem._4_4_] = 0x20;
  }
  local_418[(int)tmp._1020_4_] = 0;
  if (hash == (kvtree *)0x0) {
    printf("%sNULL LIST\n",local_418);
  }
  else {
    for (local_428 = hash->lh_first; local_428 != (kvtree_elem *)0x0;
        local_428 = (local_428->pointers).le_next) {
      kvtree_elem_print(local_428,tmp._1020_4_ + 2,tmp._1016_4_);
    }
  }
  return 0;
}

Assistant:

int kvtree_print_mode(const kvtree* hash, int indent, int mode)
{
  char tmp[KVTREE_MAX_FILENAME];
  int i;
  for (i = 0; i < indent; i++) {
    tmp[i] = ' ';
  }
  tmp[indent] = '\0';

  if (hash != NULL) {
    kvtree_elem* elem;
    LIST_FOREACH(elem, hash, pointers) {
      kvtree_elem_print(elem, indent + 2, mode);
    }
  } else {
    printf("%sNULL LIST\n", tmp);
  }
  return KVTREE_SUCCESS;
}